

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall
Matrix::CopyColumn(Matrix *this,Matrix *source_matrix,int source_column,int destination_column)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  Fraction *pFVar5;
  int local_28;
  bool local_21;
  int row;
  bool result;
  int destination_column_local;
  int source_column_local;
  Matrix *source_matrix_local;
  Matrix *this_local;
  
  local_21 = false;
  for (local_28 = 0; local_28 < this->n_; local_28 = local_28 + 1) {
    pvVar3 = std::
             vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
             ::operator[](&this->elements_,(long)local_28);
    pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                       (pvVar3,(long)destination_column);
    pFVar5 = At(source_matrix,local_28,source_column);
    bVar2 = operator!=(pvVar4,pFVar5);
    if (bVar2) {
      local_21 = true;
      pFVar5 = At(source_matrix,local_28,source_column);
      pvVar3 = std::
               vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ::operator[](&this->elements_,(long)local_28);
      pvVar4 = std::vector<Fraction,_std::allocator<Fraction>_>::operator[]
                         (pvVar3,(long)destination_column);
      iVar1 = pFVar5->denominator_;
      pvVar4->numerator_ = pFVar5->numerator_;
      pvVar4->denominator_ = iVar1;
    }
  }
  return local_21;
}

Assistant:

bool Matrix::CopyColumn(const Matrix& source_matrix, int source_column, int destination_column) {
  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != source_matrix.At(row, source_column)) {
      result = true;
      elements_[row][destination_column] = source_matrix.At(row, source_column);
    }
  }

  return result;
}